

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::anon_unknown_1::TextureFragmentShader::shadeFragments
          (TextureFragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int x;
  int iVar6;
  int iVar7;
  long lVar8;
  Vec4 texColor0;
  IVec2 position3;
  IVec2 position2;
  IVec2 position1;
  IVec2 position0;
  Vec4 color3;
  Vec4 color2;
  Vec4 color1;
  Vec4 color0;
  Vec4 vtxColor3;
  Vec4 texColor3;
  Vec4 texColor2;
  Vec4 texColor1;
  tcu local_70 [16];
  Vec4 vtxColor2;
  Vec4 vtxColor1;
  Vec4 vtxColor0;
  
  x = (int)this + 0x38;
  uVar5 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar5 = 0;
  }
  for (lVar8 = 0; uVar5 << 2 != lVar8; lVar8 = lVar8 + 4) {
    texColor0.m_data[0] = 0.0;
    texColor0.m_data[1] = 0.0;
    tcu::operator+(&packets->position,(Vector<int,_2> *)&texColor0);
    texColor0.m_data[0] = 1.4013e-45;
    texColor0.m_data[1] = 0.0;
    tcu::operator+(&packets->position,(Vector<int,_2> *)&texColor0);
    texColor0.m_data[0] = 0.0;
    texColor0.m_data[1] = 1.4013e-45;
    tcu::operator+(&packets->position,(Vector<int,_2> *)&texColor0);
    texColor0.m_data[0] = 1.4013e-45;
    texColor0.m_data[1] = 1.4013e-45;
    tcu::operator+(&packets->position,(Vector<int,_2> *)&texColor0);
    iVar2 = position0.m_data[1] * position0.m_data[0];
    iVar3 = (this->m_texture).m_size.m_data[0] + -1;
    if (iVar2 < iVar3) {
      iVar3 = iVar2;
    }
    if (iVar2 < 0) {
      iVar3 = 0;
    }
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&texColor0,x,iVar3,0);
    iVar2 = position1.m_data[1] * position1.m_data[0];
    iVar3 = (this->m_texture).m_size.m_data[0] + -1;
    if (iVar2 < iVar3) {
      iVar3 = iVar2;
    }
    if (iVar2 < 0) {
      iVar3 = 0;
    }
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&texColor1,x,iVar3,0);
    iVar2 = position2.m_data[1] * position2.m_data[0];
    iVar3 = (this->m_texture).m_size.m_data[0] + -1;
    if (iVar2 < iVar3) {
      iVar3 = iVar2;
    }
    if (iVar2 < 0) {
      iVar3 = 0;
    }
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&texColor2,x,iVar3,0);
    iVar2 = position3.m_data[1] * position3.m_data[0];
    iVar3 = (this->m_texture).m_size.m_data[0] + -1;
    if (iVar2 < iVar3) {
      iVar3 = iVar2;
    }
    if (iVar2 < 0) {
      iVar3 = 0;
    }
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&texColor3,x,iVar3,0);
    rr::readVarying<float>((rr *)&vtxColor0,packets,context,0,0);
    rr::readVarying<float>((rr *)&vtxColor1,packets,context,0,1);
    rr::readVarying<float>((rr *)&vtxColor2,packets,context,0,2);
    rr::readVarying<float>((rr *)&vtxColor3,packets,context,0,3);
    tcu::operator+((tcu *)&color1,(Vector<float,_4> *)&vtxColor0,&texColor0);
    tcu::operator*((tcu *)&color0,0.5,(Vector<float,_4> *)&color1);
    tcu::operator+((tcu *)&color2,(Vector<float,_4> *)&vtxColor1,&texColor1);
    tcu::operator*((tcu *)&color1,0.5,(Vector<float,_4> *)&color2);
    tcu::operator+((tcu *)&color3,(Vector<float,_4> *)&vtxColor2,&texColor2);
    tcu::operator*((tcu *)&color2,0.5,(Vector<float,_4> *)&color3);
    tcu::operator+(local_70,&vtxColor3,&texColor3);
    tcu::operator*((tcu *)&color3,0.5,(Vector<float,_4> *)local_70);
    pGVar1 = context->outputArray;
    iVar3 = context->numFragmentOutputs;
    iVar2 = (int)lVar8;
    iVar4 = (iVar2 + 1) * iVar3;
    iVar6 = (iVar2 + 2) * iVar3;
    iVar7 = (iVar2 + 3) * iVar3;
    iVar3 = iVar3 * iVar2;
    *(ulong *)&pGVar1[iVar3].v =
         CONCAT44(color0.m_data[1] * color0.m_data[3],color0.m_data[3] * color0.m_data[0]);
    pGVar1[iVar3].v.fData[2] = color0.m_data[2] * color0.m_data[3];
    pGVar1[iVar3].v.uData[3] = 0x3f800000;
    *(ulong *)&pGVar1[iVar4].v =
         CONCAT44(color1.m_data[1] * color1.m_data[3],color1.m_data[3] * color1.m_data[0]);
    pGVar1[iVar4].v.fData[2] = color1.m_data[2] * color1.m_data[3];
    pGVar1[iVar4].v.uData[3] = 0x3f800000;
    *(ulong *)&pGVar1[iVar6].v =
         CONCAT44(color2.m_data[1] * color2.m_data[3],color2.m_data[3] * color2.m_data[0]);
    pGVar1[iVar6].v.fData[2] = color2.m_data[2] * color2.m_data[3];
    pGVar1[iVar6].v.uData[3] = 0x3f800000;
    *(ulong *)&pGVar1[iVar7].v =
         CONCAT44(color3.m_data[1] * color3.m_data[3],color3.m_data[3] * color3.m_data[0]);
    pGVar1[iVar7].v.fData[2] = color3.m_data[2] * color3.m_data[3];
    pGVar1[iVar7].v.uData[3] = 0x3f800000;
    packets = packets + 1;
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::FragmentPacket&	packet		= packets[packetNdx];

			const tcu::IVec2	position0	= packet.position + tcu::IVec2(0, 0);
			const tcu::IVec2	position1	= packet.position + tcu::IVec2(1, 0);
			const tcu::IVec2	position2	= packet.position + tcu::IVec2(0, 1);
			const tcu::IVec2	position3	= packet.position + tcu::IVec2(1, 1);

			const tcu::Vec4		texColor0	= m_texture.getPixel(de::clamp((position0.x() * position0.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor1	= m_texture.getPixel(de::clamp((position1.x() * position1.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor2	= m_texture.getPixel(de::clamp((position2.x() * position2.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor3	= m_texture.getPixel(de::clamp((position3.x() * position3.y()), 0, m_texture.getWidth()-1), 0);

			const tcu::Vec4		vtxColor0	= rr::readVarying<float>(packet, context, 0, 0);
			const tcu::Vec4		vtxColor1	= rr::readVarying<float>(packet, context, 0, 1);
			const tcu::Vec4		vtxColor2	= rr::readVarying<float>(packet, context, 0, 2);
			const tcu::Vec4		vtxColor3	= rr::readVarying<float>(packet, context, 0, 3);

			const tcu::Vec4		color0		= 0.5f * (vtxColor0 + texColor0);
			const tcu::Vec4		color1		= 0.5f * (vtxColor1 + texColor1);
			const tcu::Vec4		color2		= 0.5f * (vtxColor2 + texColor2);
			const tcu::Vec4		color3		= 0.5f * (vtxColor3 + texColor3);

			rr::writeFragmentOutput(context, packetNdx, 0, 0, tcu::Vec4(color0.x() * color0.w(), color0.y() * color0.w(), color0.z() * color0.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 1, 0, tcu::Vec4(color1.x() * color1.w(), color1.y() * color1.w(), color1.z() * color1.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 2, 0, tcu::Vec4(color2.x() * color2.w(), color2.y() * color2.w(), color2.z() * color2.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 3, 0, tcu::Vec4(color3.x() * color3.w(), color3.y() * color3.w(), color3.z() * color3.w(), 1.0f));
		}
	}